

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O1

void compute_least_squares_endpoints_rgb
               (uint32_t N,uint8_t *pSelectors,vec4F *pSelector_weights,vec4F *pXl,vec4F *pXh,
               color_quad_u8 *pColors)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  if (N == 0) {
    fVar14 = 0.0;
    fVar15 = 0.0;
    fVar12 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar11 = 0.0;
    fVar8 = 0.0;
    fVar13 = 0.0;
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    uVar6 = 0;
    fVar13 = 0.0;
    fVar8 = 0.0;
    fVar9 = 0.0;
    fVar12 = 0.0;
    fVar14 = 0.0;
    fVar15 = 0.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    do {
      bVar1 = pSelectors[uVar6];
      fVar14 = fVar14 + (float)*(undefined8 *)pSelector_weights[bVar1].m_c;
      fVar15 = fVar15 + (float)((ulong)*(undefined8 *)pSelector_weights[bVar1].m_c >> 0x20);
      fVar7 = fVar7 + pSelector_weights[bVar1].m_c[2];
      fVar18 = pSelector_weights[bVar1].m_c[3];
      fVar13 = fVar13 + fVar18 * (float)pColors[uVar6].m_c[0];
      fVar12 = fVar12 + (float)pColors[uVar6].m_c[0];
      fVar16 = (float)(*(ushort *)(pColors[uVar6].m_c + 1) & 0xff);
      fVar17 = (float)(byte)(*(ushort *)(pColors[uVar6].m_c + 1) >> 8);
      fVar9 = fVar9 + fVar16;
      fVar10 = fVar10 + fVar18 * fVar16;
      fVar11 = fVar11 + fVar18 * fVar17;
      fVar8 = fVar8 + fVar17;
      uVar6 = uVar6 + 1;
    } while (N != uVar6);
  }
  fVar18 = fVar14 * fVar7 - fVar15 * fVar15;
  fVar18 = (float)(~-(uint)(fVar18 != 0.0) & (uint)fVar18 |
                  (uint)(1.0 / fVar18) & -(uint)(fVar18 != 0.0));
  fVar7 = fVar7 * fVar18;
  fVar15 = -fVar15 * fVar18;
  fVar18 = fVar18 * fVar14;
  pXl->m_c[0] = fVar7 * fVar13 + (fVar12 - fVar13) * fVar15;
  pXh->m_c[0] = fVar13 * fVar15 + (fVar12 - fVar13) * fVar18;
  pXl->m_c[1] = fVar7 * fVar10 + (fVar9 - fVar10) * fVar15;
  pXh->m_c[1] = fVar10 * fVar15 + (fVar9 - fVar10) * fVar18;
  pXl->m_c[2] = fVar7 * fVar11 + (fVar8 - fVar11) * fVar15;
  pXh->m_c[2] = fVar15 * fVar11 + fVar18 * (fVar8 - fVar11);
  pXl->m_c[3] = 255.0;
  pXh->m_c[3] = 255.0;
  lVar3 = 0;
  do {
    if ((pXl->m_c[lVar3] <= 0.0 && pXl->m_c[lVar3] != 0.0) || (255.0 < pXh->m_c[lVar3])) {
      if (N == 0) {
        uVar4 = 0;
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = 0xffffffff;
        uVar6 = 0;
        uVar4 = 0;
        do {
          bVar1 = *(uint8_t *)((long)pColors + uVar6 * 4);
          if (bVar1 <= uVar5) {
            uVar5 = (uint)bVar1;
          }
          uVar2 = (uint)bVar1;
          if (bVar1 < uVar4) {
            uVar2 = uVar4;
          }
          uVar4 = uVar2;
          uVar6 = uVar6 + 1;
        } while (N != uVar6);
      }
      if (uVar5 == uVar4) {
        pXl->m_c[lVar3] = (float)(int)uVar5;
        pXh->m_c[lVar3] = (float)uVar4;
      }
    }
    lVar3 = lVar3 + 1;
    pColors = (color_quad_u8 *)((long)pColors + 1);
  } while (lVar3 != 3);
  return;
}

Assistant:

static void compute_least_squares_endpoints_rgb(uint32_t N, const uint8_t *pSelectors, const vec4F *pSelector_weights, vec4F *pXl, vec4F *pXh, const color_quad_u8 *pColors)
{
	float z00 = 0.0f, z01 = 0.0f, z10 = 0.0f, z11 = 0.0f;
	float q00_r = 0.0f, q10_r = 0.0f, t_r = 0.0f;
	float q00_g = 0.0f, q10_g = 0.0f, t_g = 0.0f;
	float q00_b = 0.0f, q10_b = 0.0f, t_b = 0.0f;
	for (uint32_t i = 0; i < N; i++)
	{
		const uint32_t sel = pSelectors[i];
		z00 += pSelector_weights[sel].m_c[0];
		z10 += pSelector_weights[sel].m_c[1];
		z11 += pSelector_weights[sel].m_c[2];
		float w = pSelector_weights[sel].m_c[3];
		q00_r += w * pColors[i].m_c[0]; t_r += pColors[i].m_c[0];
		q00_g += w * pColors[i].m_c[1]; t_g += pColors[i].m_c[1];
		q00_b += w * pColors[i].m_c[2]; t_b += pColors[i].m_c[2];
	}

	q10_r = t_r - q00_r;
	q10_g = t_g - q00_g;
	q10_b = t_b - q00_b;

	z01 = z10;

	float det = z00 * z11 - z01 * z10;
	if (det != 0.0f)
		det = 1.0f / det;

	float iz00, iz01, iz10, iz11;
	iz00 = z11 * det;
	iz01 = -z01 * det;
	iz10 = -z10 * det;
	iz11 = z00 * det;

	pXl->m_c[0] = (float)(iz00 * q00_r + iz01 * q10_r); pXh->m_c[0] = (float)(iz10 * q00_r + iz11 * q10_r);
	pXl->m_c[1] = (float)(iz00 * q00_g + iz01 * q10_g); pXh->m_c[1] = (float)(iz10 * q00_g + iz11 * q10_g);
	pXl->m_c[2] = (float)(iz00 * q00_b + iz01 * q10_b); pXh->m_c[2] = (float)(iz10 * q00_b + iz11 * q10_b);
	pXl->m_c[3] = 255.0f; pXh->m_c[3] = 255.0f;

	for (uint32_t c = 0; c < 3; c++)
	{
		if ((pXl->m_c[c] < 0.0f) || (pXh->m_c[c] > 255.0f))
		{
			uint32_t lo_v = UINT32_MAX, hi_v = 0;
			for (uint32_t i = 0; i < N; i++)
			{
				lo_v = minimumu(lo_v, pColors[i].m_c[c]);
				hi_v = maximumu(hi_v, pColors[i].m_c[c]);
			}

			if (lo_v == hi_v)
			{
				pXl->m_c[c] = (float)lo_v;
				pXh->m_c[c] = (float)hi_v;
			}
		}
	}
}